

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O0

Joint * __thiscall
CS248::DynamicScene::Skeleton::createNewJoint(Skeleton *this,Joint *parent,Vector3D *endPos)

{
  Joint *this_00;
  Vector3D *in_RDX;
  Joint *in_RSI;
  Vector4D *in_RDI;
  double dVar1;
  double meshScale;
  Matrix4x4 invT;
  Matrix4x4 T;
  Vector4D endPos4d;
  Joint *newJoint;
  Matrix4x4 *in_stack_00000728;
  undefined1 local_1d8 [48];
  Skeleton *in_stack_fffffffffffffe58;
  Joint *in_stack_fffffffffffffe60;
  double local_168;
  double local_160;
  double local_158;
  Vector4D *in_stack_ffffffffffffff00;
  Matrix4x4 *in_stack_ffffffffffffff08;
  undefined1 local_d0 [128];
  Vector4D local_50;
  Joint *local_20;
  Joint *local_10;
  
  local_10 = in_RSI;
  this_00 = (Joint *)operator_new(0x160);
  Joint::Joint(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  this_00->parent = local_10;
  local_20 = this_00;
  Vector4D::Vector4D(&local_50,in_RDX,1.0);
  (*(local_20->super_SceneObject)._vptr_SceneObject[0xb])(local_d0);
  Matrix4x4::inv(in_stack_00000728);
  Matrix4x4::operator*(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  Vector4D::projectTo3D(in_RDI);
  in_RDX->x = local_168;
  in_RDX->y = local_160;
  in_RDX->z = local_158;
  (local_20->axis).x = in_RDX->x;
  (local_20->axis).y = in_RDX->y;
  (local_20->axis).z = in_RDX->z;
  (**(code **)(*(long *)in_RDI[7].z + 0x20))(local_1d8);
  dVar1 = Vector3D::norm((Vector3D *)0x21154c);
  local_20->renderScale = dVar1;
  local_20->capsuleRadius = dVar1 * local_20->capsuleRadius;
  if (local_10 != (Joint *)0x0) {
    std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::
    push_back((vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_> *
              )this_00,(value_type *)in_RDI);
  }
  std::vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_>::
  push_back((vector<CS248::DynamicScene::Joint_*,_std::allocator<CS248::DynamicScene::Joint_*>_> *)
            this_00,(value_type *)in_RDI);
  return local_20;
}

Assistant:

Joint* Skeleton::createNewJoint(Joint* parent, Vector3D endPos) {
  Joint* newJoint = new Joint(this);
  newJoint->parent = parent;
  // Get the endPos in joint's local coordinate frame
  Vector4D endPos4d(endPos, 1.);
  Matrix4x4 T = newJoint->getTransformation();
  Matrix4x4 invT = T.inv();
  endPos = (invT * endPos4d).projectTo3D();

  newJoint->axis = endPos;
  double meshScale = mesh->get_bbox().extent.norm();
  newJoint->renderScale = meshScale;
  newJoint->capsuleRadius *= meshScale;
  if (parent != nullptr) parent->kids.push_back(newJoint);
  joints.push_back(newJoint);

  return newJoint;
}